

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O2

SidTreeNode * __thiscall
COLLADASaxFWL::DocumentProcessor::resolveSid(DocumentProcessor *this,SidAddress *sidAddress)

{
  __type _Var1;
  SidTreeNode *pSVar2;
  SidTreeNode *pSVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong firstSidIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  
  pSVar2 = (SidTreeNode *)0x0;
  if ((sidAddress->mIsValid == true) && ((sidAddress->mId)._M_string_length != 0)) {
    pSVar2 = findSidTreeNodeByStringId(this,&sidAddress->mId);
    if (pSVar2 == (SidTreeNode *)0x0) {
      pSVar2 = (SidTreeNode *)0x0;
    }
    else {
      __lhs = (sidAddress->mSids).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (__lhs == (sidAddress->mSids).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        firstSidIndex = 0;
        pbVar5 = __lhs;
      }
      else {
        _Var1 = std::operator==(__lhs,&pSVar2->mSid);
        firstSidIndex = (ulong)_Var1;
        __lhs = (sidAddress->mSids).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (sidAddress->mSids).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = (ulong)(uint)((int)firstSidIndex << 5);
      for (; firstSidIndex < (ulong)((long)pbVar5 - (long)__lhs >> 5);
          firstSidIndex = firstSidIndex + 1) {
        pSVar3 = SidTreeNode::findChildBySid
                           (pSVar2,(String *)
                                   ((long)&(((sidAddress->mSids).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + uVar4));
        if (pSVar3 == (SidTreeNode *)0x0) {
          pSVar2 = resolveSidInInstance(this,pSVar2,sidAddress,firstSidIndex);
          return pSVar2;
        }
        uVar4 = uVar4 + 0x20;
        pSVar2 = pSVar3;
      }
    }
  }
  return pSVar2;
}

Assistant:

const SidTreeNode* DocumentProcessor::resolveSid( const SidAddress& sidAddress )
	{
		if ( !sidAddress.isValid() )
			return 0;

		SidTreeNode* startingPoint = 0;
		const String& id = sidAddress.getId();
		if ( !id.empty() )
		{
			// search for element with id 
			startingPoint = findSidTreeNodeByStringId( id );
		}

		if ( !startingPoint )
			return 0;

		SidTreeNode* currentNode = startingPoint;
		const SidAddress::SidList& sids = sidAddress.getSids();

		size_t i = 0;

		if ( !sids.empty() && (sids.front() == startingPoint->getSid()) )
		{
			// the first one is the start element it self exclude it from recursive search
			i = 1;
		}

		for ( size_t count = sids.size(); i < count; ++i)
		{
			const String& currentSid = sids[i];
			SidTreeNode* childNode = currentNode->findChildBySid( currentSid );

			if ( !childNode )
			{
				// we could not find the sid as a child of currentNode
				// lets try if the sid is in an instantiated element
				return resolveSidInInstance( currentNode, sidAddress, i);
			}
			else
			{
				currentNode = childNode;
			}
		}
		return currentNode;
	}